

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_string_utils.cpp
# Opt level: O3

void append_format_string(string *data,char *format,...)

{
  int iVar1;
  int iVar2;
  char in_AL;
  int iVar3;
  int iVar4;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [4096];
  undefined8 local_1108;
  undefined1 *local_1100;
  undefined1 *local_10f8;
  undefined1 local_10e8 [16];
  undefined8 local_10d8;
  undefined8 local_10d0;
  undefined8 local_10c8;
  undefined8 local_10c0;
  undefined8 local_10b8;
  undefined8 local_10a8;
  undefined8 local_1098;
  undefined8 local_1088;
  undefined8 local_1078;
  undefined8 local_1068;
  undefined8 local_1058;
  undefined8 local_1048;
  char local_1038 [4104];
  
  if (in_AL != '\0') {
    local_10b8 = in_XMM0_Qa;
    local_10a8 = in_XMM1_Qa;
    local_1098 = in_XMM2_Qa;
    local_1088 = in_XMM3_Qa;
    local_1078 = in_XMM4_Qa;
    local_1068 = in_XMM5_Qa;
    local_1058 = in_XMM6_Qa;
    local_1048 = in_XMM7_Qa;
  }
  local_10d8 = in_RDX;
  local_10d0 = in_RCX;
  local_10c8 = in_R8;
  local_10c0 = in_R9;
  memset(local_1038,0,0x1000);
  local_1100 = &stack0x00000008;
  local_1108 = 0x3000000010;
  local_10f8 = local_10e8;
  iVar3 = vsnprintf(local_1038,0x1000,format,&local_1108);
  if (0xfff < iVar3) {
    __s = (char *)0x0;
    iVar3 = 0x1000;
    do {
      if (__s != (char *)0x0) {
        free(__s);
      }
      iVar2 = iVar3 * 2;
      __s = (char *)calloc(1,(long)iVar2);
      local_1108 = 0x3000000010;
      local_1100 = &stack0x00000008;
      local_10f8 = local_10e8;
      iVar4 = vsnprintf(__s,(long)iVar2,format,&local_1108);
      iVar1 = iVar3 * -2;
      iVar3 = iVar2;
    } while (SBORROW4(iVar4,iVar2) == iVar4 + iVar1 < 0);
    if (__s != (char *)0x0) {
      std::__cxx11::string::append((char *)data);
      free(__s);
      return;
    }
  }
  std::__cxx11::string::append((char *)data);
  return;
}

Assistant:

void append_format_string(std::string& data, const char* format, ...) {
  char buf[4096] = {};
  char* backup_buf = NULL;
  int cur_buf_len = sizeof(buf);
  va_list ap;
  va_start(ap, format);
  int len = vsnprintf(buf, cur_buf_len, format, ap);
  va_end(ap);
  while(len >= cur_buf_len) {
    cur_buf_len *= 2;
    if(backup_buf) {
      free(backup_buf);
    }

    backup_buf = (char*)calloc(1, cur_buf_len);
    va_start(ap, format);
    len = vsnprintf(backup_buf, cur_buf_len, format, ap);
    va_end(ap);
  }
  

  if(backup_buf) {
    data.append(backup_buf);
    free(backup_buf);
  } else {
    data.append(buf);
  }  
}